

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_fill_iffeature(lys_module *module,lys_iffeature *iffeature,void *parent,char *value,
                       unres_schema *unres,int parent_is_feature)

{
  int iVar1;
  char *pcVar2;
  int ret;
  char *exp;
  int parent_is_feature_local;
  unres_schema *unres_local;
  char *value_local;
  void *parent_local;
  lys_iffeature *iffeature_local;
  lys_module *module_local;
  
  if ((((byte)module->field_0x40 >> 1 & 7) == 2) ||
     ((*value != '(' && (pcVar2 = strchr(value,0x20), pcVar2 == (char *)0x0)))) {
    pcVar2 = transform_iffeat_schema2json(module,value);
    if (pcVar2 == (char *)0x0) {
      free(value);
      module_local._4_4_ = 1;
    }
    else {
      free(value);
      iVar1 = resolve_iffeature_compile(iffeature,pcVar2,(lys_node *)parent,parent_is_feature,unres)
      ;
      lydict_remove(module->ctx,pcVar2);
      module_local._4_4_ = (uint)(iVar1 != 0);
    }
  }
  else {
    ly_vlog(LYE_INARG,LY_VLOG_NONE,(void *)0x0,value,"if-feature");
    free(value);
    module_local._4_4_ = 1;
  }
  return module_local._4_4_;
}

Assistant:

int
yang_fill_iffeature(struct lys_module *module, struct lys_iffeature *iffeature, void *parent,
                    char *value, struct unres_schema *unres, int parent_is_feature)
{
    const char *exp;
    int ret;

    if ((module->version != 2) && ((value[0] == '(') || strchr(value, ' '))) {
        LOGVAL(LYE_INARG, LY_VLOG_NONE, NULL, value, "if-feature");
        free(value);
        return EXIT_FAILURE;
    }

    if (!(exp = transform_iffeat_schema2json(module, value))) {
        free(value);
        return EXIT_FAILURE;
    }
    free(value);

    ret = resolve_iffeature_compile(iffeature, exp, (struct lys_node *)parent, parent_is_feature, unres);
    lydict_remove(module->ctx, exp);

    return (ret) ? EXIT_FAILURE : EXIT_SUCCESS;
}